

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_173::TypeRefining::updateTypes::WriteUpdater::~WriteUpdater(WriteUpdater *this)

{
  WriteUpdater *this_local;
  
  ~WriteUpdater(this);
  operator_delete(this,0x130);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }